

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_canvas.hpp
# Opt level: O0

RealCanvas<plot::BrailleCanvas> * __thiscall
plot::RealCanvas<plot::BrailleCanvas>::stroke<std::pair<float,float>(&)(float,float)>
          (RealCanvas<plot::BrailleCanvas> *this,Color *color,Rectf *rct,
          _func_pair<float,_float>_float_float *fn)

{
  Rect rct_00;
  anon_class_16_2_e8808043 local_58;
  rect_type local_48;
  _func_pair<float,_float>_float_float *local_28;
  _func_pair<float,_float>_float_float *fn_local;
  Rectf *rct_local;
  Color *color_local;
  RealCanvas<plot::BrailleCanvas> *this_local;
  
  local_28 = fn;
  fn_local = (_func_pair<float,_float>_float_float *)rct;
  rct_local = (Rectf *)color;
  color_local = (Color *)this;
  map(&local_48,this,rct);
  local_58.fn = local_28;
  rct_00.p1.y = local_48.p1.y;
  rct_00.p1.x = local_48.p1.x;
  rct_00.p2.x = local_48.p2.x;
  rct_00.p2.y = local_48.p2.y;
  local_58.this = this;
  BrailleCanvas::
  stroke<plot::RealCanvas<plot::BrailleCanvas>::stroke<std::pair<float,float>(&)(float,float)>(plot::Color_const&,plot::GenericRect<float>const&,std::pair<float,float>(&)(float,float))::_lambda(long)_1_>
            (&this->canvas_,color,rct_00,&local_58,Over);
  return this;
}

Assistant:

RealCanvas& stroke(Color const& color, Rectf const& rct, Fn&& fn, Args&&... args) {
        canvas_.stroke(color, map(rct), [this,&fn](typename Canvas::coord_type x) {
            auto real_bounds = fn(unmap(Point(x, 0)).x, unmap(Point(x + 1, 0)).x);
            auto base = map(Pointf(0, real_bounds.first)).y,
                 end = map(Pointf(0, real_bounds.second)).y;
            return (base != end) ? std::make_pair(base, end)
                                 : std::make_pair(base, base+1);
        }, std::forward<Args>(args)...);
        return *this;
    }